

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O2

int nhdp_domain_mpr_add(nhdp_domain_mpr *mpr)

{
  int iVar1;
  list_entity *plVar2;
  
  (mpr->_node).key = mpr->name;
  iVar1 = avl_insert(&_domain_mprs,&mpr->_node);
  if (iVar1 == 0) {
    plVar2 = &_domain_list;
    while (plVar2 = plVar2->next, plVar2->prev != _domain_list.prev) {
      if ((nhdp_domain_mpr *)plVar2[-0x28].prev == &_everyone_mprs) {
        _apply_mpr((nhdp_domain *)(plVar2 + -0x2a),(char *)(plVar2 + -0x29),
                   *(uint8_t *)&plVar2[-0x27].next);
      }
    }
    iVar1 = 0;
    if (_flooding_domain.mpr == &_everyone_mprs) {
      _apply_mpr(&_flooding_domain,_flooding_domain.mpr_name,_flooding_domain.local_willingness);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
nhdp_domain_mpr_add(struct nhdp_domain_mpr *mpr) {
  struct nhdp_domain *domain;

  /* initialize key */
  mpr->_node.key = mpr->name;

  if (avl_insert(&_domain_mprs, &mpr->_node)) {
    return -1;
  }

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->mpr == &_everyone_mprs) {
      _apply_mpr(domain, domain->mpr_name, domain->local_willingness);
    }
  }
  if (_flooding_domain.mpr == &_everyone_mprs) {
    _apply_mpr(&_flooding_domain, _flooding_domain.mpr_name, _flooding_domain.local_willingness);
  }
  return 0;
}